

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O2

bool __thiscall
QCss::Parser::parse(Parser *this,StyleSheet *styleSheet,CaseSensitivity nameCaseSensitivity)

{
  bool bVar1;
  bool bVar2;
  long in_FS_OFFSET;
  QLatin1StringView str;
  StyleRule local_78;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  str.m_data = "charset";
  str.m_size = 7;
  bVar1 = testTokenAndEndsWith(this,ATKEYWORD_SYM,str);
  if (bVar1) {
    do {
      do {
        bVar1 = test(this,S);
      } while (bVar1);
      bVar1 = test(this,CDO);
    } while ((bVar1) || (bVar1 = test(this,CDC), bVar1));
    bVar1 = next(this,STRING);
    if ((!bVar1) || (bVar1 = next(this,SEMICOLON), !bVar1)) {
LAB_00545b96:
      bVar1 = false;
      goto LAB_00545b98;
    }
  }
  do {
    do {
      bVar1 = test(this,S);
    } while (bVar1);
    bVar1 = test(this,CDO);
  } while ((bVar1) || (bVar1 = test(this,CDC), bVar1));
  while (bVar1 = testImport(this), bVar1) {
    local_78.declarations.d.ptr = (Declaration *)0x0;
    local_78.declarations.d.size = 0;
    local_78.selectors.d.size = 0;
    local_78.declarations.d.d = (Data *)0x0;
    local_78.selectors.d.d = (Data *)0x0;
    local_78.selectors.d.ptr = (Selector *)0x0;
    bVar1 = parseImport(this,(ImportRule *)&local_78);
    if (!bVar1) {
      ImportRule::~ImportRule((ImportRule *)&local_78);
      goto LAB_00545b96;
    }
    QList<QCss::ImportRule>::emplaceBack<QCss::ImportRule_const&>
              (&styleSheet->importRules,(ImportRule *)&local_78);
    do {
      do {
        bVar1 = test(this,S);
      } while (bVar1);
      bVar1 = test(this,CDO);
    } while ((bVar1) || (bVar1 = test(this,CDC), bVar1));
    ImportRule::~ImportRule((ImportRule *)&local_78);
  }
  bVar1 = false;
  do {
    bVar2 = testMedia(this);
    if (bVar2) {
      local_78.declarations.d.ptr = (Declaration *)0x0;
      local_78.declarations.d.size = 0;
      local_78.selectors.d.size = 0;
      local_78.declarations.d.d = (Data *)0x0;
      local_78.selectors.d.d = (Data *)0x0;
      local_78.selectors.d.ptr = (Selector *)0x0;
      bVar2 = parseMedia(this,(MediaRule *)&local_78);
      if (!bVar2) {
        MediaRule::~MediaRule((MediaRule *)&local_78);
        goto LAB_00545b96;
      }
      QList<QCss::MediaRule>::emplaceBack<QCss::MediaRule_const&>
                (&styleSheet->mediaRules,(MediaRule *)&local_78);
      MediaRule::~MediaRule((MediaRule *)&local_78);
    }
    else {
      bVar2 = testPage(this);
      if (bVar2) {
        local_78.declarations.d.ptr = (Declaration *)0x0;
        local_78.declarations.d.size = 0;
        local_78.selectors.d.size = 0;
        local_78.declarations.d.d = (Data *)0x0;
        local_78.selectors.d.d = (Data *)0x0;
        local_78.selectors.d.ptr = (Selector *)0x0;
        bVar2 = parsePage(this,(PageRule *)&local_78);
        if (!bVar2) {
          PageRule::~PageRule((PageRule *)&local_78);
          goto LAB_00545b96;
        }
        QList<QCss::PageRule>::emplaceBack<QCss::PageRule_const&>
                  (&styleSheet->pageRules,(PageRule *)&local_78);
        PageRule::~PageRule((PageRule *)&local_78);
      }
      else {
        bVar2 = testAnimation(this);
        if (bVar2) {
          local_78.declarations.d.ptr = (Declaration *)0x0;
          local_78.declarations.d.size = 0;
          local_78.selectors.d.size = 0;
          local_78.declarations.d.d = (Data *)0x0;
          local_78.selectors.d.d = (Data *)0x0;
          local_78.selectors.d.ptr = (Selector *)0x0;
          bVar2 = parseAnimation(this,(AnimationRule *)&local_78);
          if (!bVar2) {
            AnimationRule::~AnimationRule((AnimationRule *)&local_78);
            goto LAB_00545b96;
          }
          QList<QCss::AnimationRule>::emplaceBack<QCss::AnimationRule_const&>
                    (&styleSheet->animationRules,(AnimationRule *)&local_78);
          AnimationRule::~AnimationRule((AnimationRule *)&local_78);
        }
        else {
          bVar2 = testSimpleSelector(this);
          if (bVar2) {
            local_78.selectors.d.d = (Data *)0x0;
            local_78.selectors.d.ptr = (Selector *)0x0;
            local_78.selectors.d.size = 0;
            local_78.declarations.d.d = (Data *)0x0;
            local_78.declarations.d.ptr = (Declaration *)0x0;
            local_78.declarations.d.size = 0;
            local_78.order = 0;
            local_78._52_4_ = 0xaaaaaaaa;
            bVar2 = parseRuleset(this,&local_78);
            if (!bVar2) {
              StyleRule::~StyleRule(&local_78);
              goto LAB_00545b96;
            }
            QList<QCss::StyleRule>::emplaceBack<QCss::StyleRule_const&>
                      (&styleSheet->styleRules,&local_78);
            StyleRule::~StyleRule(&local_78);
          }
          else {
            bVar2 = test(this,ATKEYWORD_SYM);
            if (bVar2) {
              bVar2 = until(this,RBRACE,NONE);
              if (!bVar2) goto LAB_00545b98;
            }
            else if ((long)this->index < (this->symbols).d.size) goto LAB_00545b96;
          }
        }
      }
    }
    do {
      do {
        bVar2 = test(this,S);
      } while (bVar2);
      bVar2 = test(this,CDO);
    } while ((bVar2) || (bVar2 = test(this,CDC), bVar2));
  } while ((long)this->index < (this->symbols).d.size);
  StyleSheet::buildIndexes(styleSheet,nameCaseSensitivity);
  bVar1 = true;
LAB_00545b98:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar1;
}

Assistant:

bool Parser::parse(StyleSheet *styleSheet, Qt::CaseSensitivity nameCaseSensitivity)
{
    if (testTokenAndEndsWith(ATKEYWORD_SYM, "charset"_L1)) {
        while (test(S) || test(CDO) || test(CDC)) {}
        if (!next(STRING)) return false;
        if (!next(SEMICOLON)) return false;
    }

    while (test(S) || test(CDO) || test(CDC)) {}

    while (testImport()) {
        ImportRule rule;
        if (!parseImport(&rule)) return false;
        styleSheet->importRules.append(rule);
        while (test(S) || test(CDO) || test(CDC)) {}
    }

    do {
        if (testMedia()) {
            MediaRule rule;
            if (!parseMedia(&rule)) return false;
            styleSheet->mediaRules.append(rule);
        } else if (testPage()) {
            PageRule rule;
            if (!parsePage(&rule)) return false;
            styleSheet->pageRules.append(rule);
        } else if (testAnimation()) {
            AnimationRule rule;
            if (!parseAnimation(&rule)) return false;
            styleSheet->animationRules.append(rule);
        } else if (testRuleset()) {
            StyleRule rule;
            if (!parseRuleset(&rule)) return false;
            styleSheet->styleRules.append(rule);
        } else if (test(ATKEYWORD_SYM)) {
            if (!until(RBRACE)) return false;
        } else if (hasNext()) {
            return false;
        }
        while (test(S) || test(CDO) || test(CDC)) {}
    } while (hasNext());
    styleSheet->buildIndexes(nameCaseSensitivity);
    return true;
}